

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_edit_draw_text(nk_command_buffer *out,nk_style_edit *style,float pos_x,float pos_y,
                      float x_offset,char *text,int byte_len,float row_height,nk_user_font *font,
                      nk_color background,nk_color foreground,nk_bool is_selected)

{
  long lVar1;
  nk_style_edit *pnVar2;
  nk_command_buffer *pnVar3;
  nk_style_edit *pnVar4;
  int iVar5;
  undefined4 in_register_0000000c;
  long lVar6;
  long lVar7;
  nk_user_font *f;
  int iVar8;
  long lVar9;
  int iVar10;
  float fVar11;
  float fVar12;
  float in_XMM0_Db;
  float in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar14;
  float fVar13;
  undefined4 in_XMM3_Db;
  nk_rect rect;
  nk_rect b;
  nk_rect rect_00;
  nk_rect b_00;
  nk_text txt;
  int local_100;
  nk_rune local_f8;
  int local_f4;
  nk_color local_f0;
  float local_ec;
  float local_e8;
  float fStack_e4;
  undefined8 uStack_e0;
  nk_style_edit *local_d8;
  ulong local_d0;
  nk_command_buffer *local_c8;
  nk_user_font *local_c0;
  nk_style_edit *local_b8;
  ulong local_b0;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  undefined4 uStack_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  float local_88;
  undefined4 uStack_84;
  float local_78;
  nk_text local_68;
  undefined8 local_58;
  byte *local_40;
  ulong local_38;
  
  iVar10 = (int)text;
  if (iVar10 != 0 && style != (nk_style_edit *)0x0) {
    local_f8 = 0;
    local_68.padding.x = 0.0;
    local_68.padding.y = 0.0;
    local_f0 = SUB84(font,0);
    local_ec = pos_y;
    local_a8 = pos_x;
    fStack_a4 = in_XMM0_Db;
    fStack_a0 = in_XMM0_Dc;
    uStack_9c = in_XMM0_Dd;
    local_88 = row_height;
    uStack_84 = in_XMM3_Db;
    local_78 = x_offset;
    local_68.background = local_f0;
    local_68.text = background;
    iVar5 = nk_utf_decode((char *)style,&local_f8,iVar10);
    if (0 < iVar10 && iVar5 != 0) {
      local_78 = local_78 + local_a8;
      local_40 = (byte *)((long)&(style->normal).type + 1);
      local_98 = 0;
      uStack_90 = 0;
      local_d0 = 0;
      local_100 = 0;
      local_f4 = iVar10;
      local_d8 = style;
      local_c8 = out;
      local_c0 = (nk_user_font *)CONCAT44(in_register_0000000c,byte_len);
      local_b8 = style;
      local_38 = (ulong)text & 0xffffffff;
LAB_0012f397:
      local_e8 = 0.0;
      fStack_e4 = 0.0;
      uStack_e0 = 0;
      do {
        lVar7 = (long)local_100;
        lVar6 = lVar7 << 0x20;
        local_b0 = (ulong)(uint)(local_f4 - local_100);
        local_58 = local_40 + lVar7;
        iVar10 = -1;
        lVar9 = 0;
LAB_0012f3d7:
        pnVar2 = local_b8;
        f = local_c0;
        pnVar3 = local_c8;
        fVar11 = fStack_e4;
        if (local_f8 == 0xd) {
          lVar1 = lVar9 + lVar7 + 1;
          iVar5 = nk_utf_decode((char *)(local_58 + lVar9),&local_f8,(int)local_b0 + iVar10);
          lVar9 = lVar9 + 1;
          if (lVar1 < (long)local_38) goto code_r0x0012f419;
          goto LAB_0012f5ce;
        }
        iVar8 = (int)lVar9;
        if (local_f8 == 10) goto LAB_0012f4b6;
        fVar11 = (*local_c0->width)(local_c0->userdata,local_c0->height,
                                    (char *)((long)&(local_b8->normal).type + (lVar6 >> 0x20)),iVar5
                                   );
        local_e8 = local_e8 + fVar11;
        iVar10 = local_100 + iVar5;
        local_100 = iVar10 + iVar8;
        iVar5 = nk_utf_decode((char *)((long)&(pnVar2->normal).type + (long)local_100),&local_f8,
                              ((int)local_b0 - iVar5) - iVar8);
        if ((local_f4 <= local_100) || (iVar5 == 0)) {
          local_100 = iVar10 + iVar8;
LAB_0012f5e0:
          pnVar4 = local_b8;
          pnVar3 = local_c8;
          pnVar2 = local_d8;
          fVar11 = fStack_e4;
          if (local_e8 <= 0.0) {
            return;
          }
          fVar13 = (float)local_98 + local_ec;
          fVar12 = local_a8;
          if ((int)local_d0 == 0) {
            fVar12 = local_78;
          }
          fVar14 = local_88;
          if (foreground != (nk_color)0x0) {
            fStack_a0 = fStack_a4;
            uStack_9c = local_98._4_4_;
            fStack_e4 = local_88;
            uStack_e0 = CONCAT44(uStack_84,fVar11);
            rect_00.y = fVar13;
            rect_00.x = fVar12;
            rect_00.h = local_88;
            rect_00.w = local_e8;
            local_a8 = fVar12;
            fStack_a4 = fVar13;
            nk_fill_rect(local_c8,rect_00,0.0,local_f0);
            fVar12 = local_a8;
            fVar13 = fStack_a4;
            fVar14 = fStack_e4;
          }
          b_00.y = fVar13;
          b_00.x = fVar12;
          b_00.h = fVar14;
          b_00.w = local_e8;
          nk_widget_text(pnVar3,b_00,(char *)pnVar2,((int)pnVar4 + local_100) - (int)pnVar2,
                         &local_68,0x11,f);
          return;
        }
      } while( true );
    }
  }
  return;
code_r0x0012f419:
  lVar6 = lVar6 + 0x100000000;
  iVar10 = iVar10 + -1;
  if (iVar5 == 0) {
LAB_0012f5ce:
    local_100 = local_100 + (int)lVar9;
    f = local_c0;
    goto LAB_0012f5e0;
  }
  goto LAB_0012f3d7;
LAB_0012f4b6:
  fVar13 = (float)local_98 + local_ec;
  fVar12 = local_a8;
  if ((int)local_d0 == 0) {
    fVar12 = local_78;
  }
  fVar14 = local_88;
  if (foreground != (nk_color)0x0) {
    fStack_e4 = local_88;
    uStack_e0 = CONCAT44(uStack_84,fVar11);
    local_58 = (byte *)CONCAT44(fVar13,fVar12);
    rect.y = fVar13;
    rect.x = fVar12;
    rect.h = local_88;
    rect.w = local_e8;
    nk_fill_rect(local_c8,rect,0.0,local_f0);
    fVar14 = fStack_e4;
    fVar12 = (float)local_58;
    fVar13 = local_58._4_4_;
  }
  pnVar2 = local_b8;
  b.y = fVar13;
  b.x = fVar12;
  b.h = fVar14;
  b.w = local_e8;
  nk_widget_text(pnVar3,b,(char *)local_d8,
                 ((int)((ulong)lVar6 >> 0x20) + (int)local_b8) - (int)local_d8,&local_68,0x12,f);
  local_100 = local_100 + iVar8 + 1;
  local_d8 = (nk_style_edit *)((long)&(pnVar2->normal).type + (long)local_100);
  iVar5 = nk_utf_decode((char *)local_d8,&local_f8,(int)local_b0 + iVar10);
  if (local_f4 <= local_100) {
    return;
  }
  local_d0 = (ulong)((int)local_d0 + 1);
  local_98 = CONCAT44(local_98._4_4_,(float)local_98 + local_88);
  if (iVar5 == 0) {
    return;
  }
  goto LAB_0012f397;
}

Assistant:

NK_LIB void
nk_edit_draw_text(struct nk_command_buffer *out,
const struct nk_style_edit *style, float pos_x, float pos_y,
float x_offset, const char *text, int byte_len, float row_height,
const struct nk_user_font *font, struct nk_color background,
struct nk_color foreground, nk_bool is_selected)
{
NK_ASSERT(out);
NK_ASSERT(font);
NK_ASSERT(style);
if (!text || !byte_len || !out || !style) return;

{int glyph_len = 0;
nk_rune unicode = 0;
int text_len = 0;
float line_width = 0;
float glyph_width;
const char *line = text;
float line_offset = 0;
int line_count = 0;

struct nk_text txt;
txt.padding = nk_vec2(0,0);
txt.background = background;
txt.text = foreground;

glyph_len = nk_utf_decode(text+text_len, &unicode, byte_len-text_len);
if (!glyph_len) return;
while ((text_len < byte_len) && glyph_len)
{
if (unicode == '\n') {
/* new line separator so draw previous line */
struct nk_rect label;
label.y = pos_y + line_offset;
label.h = row_height;
label.w = line_width;
label.x = pos_x;
if (!line_count)
label.x += x_offset;

if (is_selected) /* selection needs to draw different background color */
nk_fill_rect(out, label, 0, background);
nk_widget_text(out, label, line, (int)((text + text_len) - line),
&txt, NK_TEXT_CENTERED, font);

text_len++;
line_count++;
line_width = 0;
line = text + text_len;
line_offset += row_height;
glyph_len = nk_utf_decode(text + text_len, &unicode, (int)(byte_len-text_len));
continue;
}
if (unicode == '\r') {
text_len++;
glyph_len = nk_utf_decode(text + text_len, &unicode, byte_len-text_len);
continue;
}
glyph_width = font->width(font->userdata, font->height, text+text_len, glyph_len);
line_width += (float)glyph_width;
text_len += glyph_len;
glyph_len = nk_utf_decode(text + text_len, &unicode, byte_len-text_len);
continue;
}
if (line_width > 0) {
/* draw last line */
struct nk_rect label;
label.y = pos_y + line_offset;
label.h = row_height;
label.w = line_width;
label.x = pos_x;
if (!line_count)
label.x += x_offset;

if (is_selected)
nk_fill_rect(out, label, 0, background);
nk_widget_text(out, label, line, (int)((text + text_len) - line),
&txt, NK_TEXT_LEFT, font);
}}
}